

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O1

void __thiscall OSTEI_HRR_Writer::WriteHRR_Ket_General_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OSTEI_HRR_Algorithm_Base *pOVar2;
  _Type aiVar3;
  pointer pcVar4;
  RRStepType step;
  ostream *poVar5;
  pointer tam;
  string local_108;
  string local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  QAMList local_a8;
  DAM local_90;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  char local_48 [24];
  
  pOVar2 = this->hrr_algo_;
  aiVar3 = *(_Type *)((am->qam)._M_elems + 2);
  local_c8 = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  paVar1 = &local_90.tag.field_2;
  if (local_c8 == &local_b8) {
    local_90.tag.field_2._8_8_ = local_b8._8_8_;
    local_90.tag._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.tag._M_dataplus._M_p = (pointer)local_c8;
  }
  local_90.tag._M_string_length = local_c0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_c8 = &local_b8;
  local_90.dam._M_elems = aiVar3;
  step = OSTEI_HRR_Algorithm_Base::GetKetRRStep(pOVar2,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.tag._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.tag._M_dataplus._M_p);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ostei_general_hrr_",0x12);
  RRStepTypeToStr_abi_cxx11_(&local_e8,step);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_e8._M_dataplus._M_p,local_e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", hCD, ",7);
  paVar1 = &local_e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  pOVar2 = this->hrr_algo_;
  local_68._0_4_ = (am->qam)._M_elems[0];
  local_68._4_4_ = (am->qam)._M_elems[1];
  local_68._8_4_ = (am->qam)._M_elems[2];
  local_68._12_4_ = (am->qam)._M_elems[3];
  pcVar4 = (am->tag)._M_dataplus._M_p;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar4,pcVar4 + (am->tag)._M_string_length);
  OSTEI_HRR_Algorithm_Base::GenerateAMReq(&local_a8,pOVar2,(QAM *)local_68,step);
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (local_a8.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_a8.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    tam = local_a8.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start;
    do {
      local_e8.field_2._M_allocated_capacity._0_4_ = 0x525248;
      local_e8._M_string_length = 3;
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      ArrVarName(&local_108,tam,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_108._M_dataplus._M_p,local_108._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      tam = tam + 1;
    } while (tam != local_a8.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_a8);
  local_e8.field_2._M_allocated_capacity._0_4_ = 0x525248;
  local_e8._M_string_length = 3;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  ArrVarName(&local_108,am,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Ket_General_(std::ostream & os, QAM am) const
{
    // call function
    RRStepType rrstep = hrr_algo_.GetKetRRStep({am[2], am[3]});
    os << indent4 << "ostei_general_hrr_" << RRStepTypeToStr(rrstep)
       << "(" << am[0] << ", " << am[1] << ", " << am[2] << ", " << am[3] << ", hCD, ";

    for(const auto & it : hrr_algo_.GenerateAMReq(am, rrstep))
        os << HRRVarName(it) << ", ";

    os << HRRVarName(am) << ");\n";
}